

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::OFFImporter::InternReadFile
          (OFFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  float *pfVar2;
  size_t __n;
  char cVar3;
  bool bVar4;
  size_type end;
  aiScene *paVar5;
  int iVar6;
  undefined4 extraout_var;
  aiMesh **ppaVar7;
  aiMesh *paVar8;
  ulong *puVar9;
  aiVector3D *paVar10;
  aiVector3D *__s;
  aiColor4D *paVar11;
  char *pcVar12;
  Logger *pLVar13;
  aiNode *this_00;
  uint *puVar14;
  aiMaterial **ppaVar15;
  aiMaterial *this_01;
  long *plVar16;
  runtime_error *prVar17;
  byte bVar18;
  long lVar19;
  long *plVar20;
  aiFace *paVar21;
  ulong uVar22;
  ulong uVar23;
  byte *pbVar24;
  uint uVar25;
  uint i;
  ulong uVar26;
  long **pplVar27;
  int twosided;
  vector<char,_std::allocator<char>_> mBuffer2;
  ai_real *vec [3];
  char line [4096];
  byte *local_10d8;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  undefined4 local_10c0;
  float local_10bc;
  ulong local_10b8;
  ulong local_10b0;
  ulong local_10a8;
  aiMesh *local_10a0;
  ulong local_1098;
  aiColor4D **local_1090;
  ulong local_1088;
  aiVector3D **local_1080;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  aiVector3D *local_1058;
  float *pfStack_1050;
  float *local_1048;
  aiScene *local_1040;
  long *local_1038;
  long local_1030;
  long local_1028;
  long lStack_1020;
  IOStream *stream;
  
  local_1038 = &local_1028;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1038,"rb","");
  iVar6 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_1038);
  stream = (IOStream *)CONCAT44(extraout_var,iVar6);
  if (local_1038 != &local_1028) {
    operator_delete(local_1038);
  }
  if (stream == (IOStream *)0x0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_1078,"Failed to open OFF file ",pFile);
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_1078);
    local_1038 = (long *)*plVar16;
    plVar20 = plVar16 + 2;
    if (local_1038 == plVar20) {
      local_1028 = *plVar20;
      lStack_1020 = plVar16[3];
      local_1038 = &local_1028;
    }
    else {
      local_1028 = *plVar20;
    }
    local_1030 = plVar16[1];
    *plVar16 = (long)plVar20;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    std::runtime_error::runtime_error(prVar17,(string *)&local_1038);
    *(undefined ***)prVar17 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1078._M_dataplus._M_p = (pointer)0x0;
  local_1078._M_string_length = 0;
  local_1078.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (stream,(vector<char,_std::allocator<char>_> *)&local_1078,FORBID_EMPTY);
  end = local_1078._M_string_length;
  local_10d8 = (byte *)local_1078._M_dataplus._M_p;
  NextToken((char **)&local_10d8,(char *)local_1078._M_string_length);
  pbVar24 = (byte *)(end + -2);
  if (((local_10d8 < pbVar24) && (*local_10d8 == 0x53)) && (local_10d8[1] == 0x54)) {
    local_10d8 = local_10d8 + 2;
    pbVar24 = (byte *)CONCAT71((int7)((ulong)pbVar24 >> 8),1);
    local_10cc = SUB84(pbVar24,0);
  }
  else {
    local_10cc = 0;
  }
  pbVar1 = (byte *)(end + -1);
  if ((local_10d8 < pbVar1) && (*local_10d8 == 0x43)) {
    local_10d8 = local_10d8 + 1;
    pbVar24 = (byte *)CONCAT71((int7)((ulong)pbVar24 >> 8),1);
    local_10c4 = SUB84(pbVar24,0);
  }
  else {
    local_10c4 = 0;
  }
  if ((local_10d8 < pbVar1) && (*local_10d8 == 0x4e)) {
    local_10d8 = local_10d8 + 1;
    pbVar24 = (byte *)CONCAT71((int7)((ulong)pbVar24 >> 8),1);
    local_10c0 = SUB84(pbVar24,0);
  }
  else {
    local_10c0 = 0;
  }
  if ((local_10d8 < pbVar1) && (*local_10d8 == 0x34)) {
    local_10d8 = local_10d8 + 1;
    local_10c8 = (undefined4)CONCAT71((int7)((ulong)pbVar24 >> 8),1);
  }
  else {
    local_10c8 = 0;
  }
  if ((local_10d8 < pbVar1) && (*local_10d8 == 0x6e)) {
    local_10d8 = local_10d8 + 1;
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  if ((((local_10d8 < (byte *)(end + -3)) && (*local_10d8 == 0x4f)) && (local_10d8[1] == 0x46)) &&
     (local_10d8[2] == 0x46)) {
    local_10d8 = local_10d8 + 3;
    NextToken((char **)&local_10d8,(char *)end);
  }
  else {
    NextToken((char **)&local_10d8,(char *)end);
    if ((pbVar1 <= local_10d8) || ((byte)(*local_10d8 - 0x3a) < 0xf6)) {
      prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_1038 = &local_1028;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1038,"OFF: Header is invalid","");
      std::runtime_error::runtime_error(prVar17,(string *)&local_1038);
      *(undefined ***)prVar17 = &PTR__runtime_error_00875f28;
      __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_10c8 = 0;
  }
  local_10b0 = 3;
  if (bVar4) {
    bVar18 = *local_10d8;
    if ((byte)(bVar18 - 0x3a) < 0xf6) {
      NextToken((char **)&local_10d8,(char *)end);
      local_10b0 = 0;
    }
    else {
      uVar26 = 0;
      do {
        uVar25 = (uint)(byte)(bVar18 - 0x30) + (int)uVar26 * 10;
        uVar26 = (ulong)uVar25;
        bVar18 = local_10d8[1];
        local_10d8 = local_10d8 + 1;
      } while (0xf5 < (byte)(bVar18 - 0x3a));
      NextToken((char **)&local_10d8,(char *)end);
      local_10b0 = uVar26;
      if (3 < uVar25) {
        prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_1038 = &local_1028;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1038,
                   "OFF: Number of vertex coordinates higher than 3 unsupported","");
        std::runtime_error::runtime_error(prVar17,(string *)&local_1038);
        *(undefined ***)prVar17 = &PTR__runtime_error_00875f28;
        __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  NextToken((char **)&local_10d8,(char *)end);
  uVar26 = 0;
  bVar18 = *local_10d8;
  while (0xf5 < (byte)(bVar18 - 0x3a)) {
    uVar26 = (ulong)((uint)(byte)(bVar18 - 0x30) + (int)uVar26 * 10);
    pbVar24 = local_10d8 + 1;
    local_10d8 = local_10d8 + 1;
    bVar18 = *pbVar24;
  }
  NextToken((char **)&local_10d8,(char *)end);
  local_10a8 = 0;
  bVar18 = *local_10d8;
  while (0xf5 < (byte)(bVar18 - 0x3a)) {
    local_10a8 = (ulong)((uint)(byte)(bVar18 - 0x30) + (int)local_10a8 * 10);
    pbVar24 = local_10d8 + 1;
    local_10d8 = local_10d8 + 1;
    bVar18 = *pbVar24;
  }
  NextToken((char **)&local_10d8,(char *)end);
  bVar18 = *local_10d8;
  while (0xf5 < (byte)(bVar18 - 0x3a)) {
    pbVar24 = local_10d8 + 1;
    local_10d8 = local_10d8 + 1;
    bVar18 = *pbVar24;
  }
  NextToken((char **)&local_10d8,(char *)end);
  if ((int)uVar26 == 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"OFF: There are no valid vertices","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_1038);
    *(undefined ***)prVar17 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((int)local_10a8 == 0) {
    prVar17 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1038 = &local_1028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1038,"OFF: There are no valid faces","");
    std::runtime_error::runtime_error(prVar17,(string *)&local_1038);
    *(undefined ***)prVar17 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar17,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pScene->mNumMeshes = 1;
  ppaVar7 = (aiMesh **)operator_new__(8);
  pScene->mMeshes = ppaVar7;
  local_1098 = uVar26;
  local_1040 = pScene;
  paVar8 = (aiMesh *)operator_new(0x520);
  paVar8->mPrimitiveTypes = 0;
  paVar8->mNumVertices = 0;
  local_1080 = &paVar8->mVertices;
  memset(local_1080,0,0xcc);
  paVar8->mBones = (aiBone **)0x0;
  paVar8->mMaterialIndex = 0;
  (paVar8->mName).length = 0;
  (paVar8->mName).data[0] = '\0';
  memset((paVar8->mName).data + 1,0x1b,0x3ff);
  paVar8->mNumAnimMeshes = 0;
  paVar8->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar8->mMethod = 0;
  (paVar8->mAABB).mMin.x = 0.0;
  (paVar8->mAABB).mMin.y = 0.0;
  (paVar8->mAABB).mMin.z = 0.0;
  (paVar8->mAABB).mMax.x = 0.0;
  (paVar8->mAABB).mMax.y = 0.0;
  (paVar8->mAABB).mMax.z = 0.0;
  local_1090 = paVar8->mColors;
  memset(local_1090,0,0xa0);
  *ppaVar7 = paVar8;
  paVar8->mNumFaces = (uint)local_10a8;
  uVar26 = local_10a8 & 0xffffffff;
  puVar9 = (ulong *)operator_new__(uVar26 * 0x10 + 8);
  *puVar9 = uVar26;
  paVar21 = (aiFace *)(puVar9 + 1);
  do {
    paVar21->mNumIndices = 0;
    paVar21->mIndices = (uint *)0x0;
    paVar21 = paVar21 + 1;
  } while (paVar21 != (aiFace *)(puVar9 + uVar26 * 2 + 1));
  paVar8->mFaces = (aiFace *)(puVar9 + 1);
  paVar8->mNumVertices = (uint)local_1098;
  local_1088 = local_1098 & 0xffffffff;
  uVar26 = local_1088 * 0xc;
  paVar10 = (aiVector3D *)operator_new__(uVar26);
  __n = ((uVar26 - 0xc) / 0xc) * 0xc + 0xc;
  __s = (aiVector3D *)0x0;
  memset(paVar10,0,__n);
  *local_1080 = paVar10;
  if ((char)local_10c0 != '\0') {
    __s = (aiVector3D *)operator_new__(uVar26);
    memset(__s,0,__n);
  }
  paVar8->mNormals = __s;
  if ((char)local_10c4 == '\0') {
    paVar11 = (aiColor4D *)0x0;
  }
  else {
    uVar23 = local_1088 << 4;
    paVar11 = (aiColor4D *)operator_new__(uVar23);
    memset(paVar11,0,uVar23);
  }
  *local_1090 = paVar11;
  if ((char)local_10cc != '\0') {
    paVar8->mNumUVComponents[0] = 2;
    paVar10 = (aiVector3D *)operator_new__(uVar26);
    memset(paVar10,0,__n);
    paVar8->mTextureCoords[0] = paVar10;
  }
  uVar23 = local_10b0 & 0xffffffff;
  uVar26 = 0;
  pbVar24 = local_10d8;
  local_10a0 = paVar8;
  do {
    bVar18 = *pbVar24;
    if (bVar18 == 0) {
      pLVar13 = DefaultLogger::get();
      Logger::error(pLVar13,"OFF: The number of verts in the header is incorrect");
      break;
    }
    for (lVar19 = 0;
        ((0xd < bVar18 || ((0x3401U >> (bVar18 & 0x1f) & 1) == 0)) && (lVar19 != 0x1000));
        lVar19 = lVar19 + 1) {
      *(byte *)((long)&local_1038 + lVar19) = bVar18;
      bVar18 = pbVar24[lVar19 + 1];
    }
    *(undefined1 *)((long)&local_1038 + lVar19) = 0;
    pbVar24 = pbVar24 + lVar19;
    while ((*pbVar24 < 0xe && ((0x3400U >> (*pbVar24 & 0x1f) & 1) != 0))) {
      pbVar24 = pbVar24 + 1;
    }
    paVar10 = *local_1080;
    local_10b8 = uVar26 * 3;
    local_1058 = paVar10 + uVar26;
    pfStack_1050 = &paVar10[uVar26].y;
    local_1048 = &paVar10[uVar26].z;
    pplVar27 = &local_1038;
    if ((int)local_10b0 != 0) {
      uVar22 = 0;
      do {
        for (; (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
            pplVar27 = (long **)((long)pplVar27 + 1)) {
        }
        pplVar27 = (long **)fast_atoreal_move<float>
                                      ((char *)pplVar27,&(&local_1058)[uVar22]->x,true);
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar23);
    }
    if ((char)local_10c8 != '\0') {
      for (; (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
          pplVar27 = (long **)((long)pplVar27 + 1)) {
      }
      local_10bc = 1.0;
      pplVar27 = (long **)fast_atoreal_move<float>((char *)pplVar27,&local_10bc,true);
      if ((int)local_10b0 != 0) {
        uVar22 = 0;
        do {
          (&local_1058)[uVar22]->x = (&local_1058)[uVar22]->x / local_10bc;
          uVar22 = uVar22 + 1;
        } while (uVar23 != uVar22);
      }
    }
    if ((char)local_10c0 != '\0') {
      for (; (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
          pplVar27 = (long **)((long)pplVar27 + 1)) {
      }
      pfVar2 = &local_10a0->mNormals->x + local_10b8;
      for (pcVar12 = fast_atoreal_move<float>((char *)pplVar27,pfVar2,true);
          (*pcVar12 == ' ' || (*pcVar12 == '\t')); pcVar12 = pcVar12 + 1) {
      }
      for (pplVar27 = (long **)fast_atoreal_move<float>(pcVar12,pfVar2 + 1,true);
          (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
          pplVar27 = (long **)((long)pplVar27 + 1)) {
      }
      fast_atoreal_move<float>((char *)pplVar27,pfVar2 + 2,true);
    }
    if ((char)local_10c4 != '\0') {
      for (; (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
          pplVar27 = (long **)((long)pplVar27 + 1)) {
      }
      paVar11 = *local_1090 + uVar26;
      pplVar27 = (long **)fast_atoreal_move<float>((char *)pplVar27,&paVar11->r,true);
      uVar22 = (ulong)*(byte *)pplVar27;
      if ((uVar22 < 0x24) && ((0x800002400U >> (uVar22 & 0x3f) & 1) != 0)) {
        paVar11->g = 0.0;
      }
      else {
        while (((char)uVar22 == ' ' || ((int)uVar22 == 9))) {
          pbVar1 = (byte *)((long)pplVar27 + 1);
          pplVar27 = (long **)((long)pplVar27 + 1);
          uVar22 = (ulong)*pbVar1;
        }
        pplVar27 = (long **)fast_atoreal_move<float>((char *)pplVar27,&paVar11->g,true);
      }
      uVar22 = (ulong)*(byte *)pplVar27;
      if ((uVar22 < 0x24) && ((0x800002400U >> (uVar22 & 0x3f) & 1) != 0)) {
        paVar11->b = 0.0;
      }
      else {
        while (((char)uVar22 == ' ' || ((int)uVar22 == 9))) {
          pbVar1 = (byte *)((long)pplVar27 + 1);
          pplVar27 = (long **)((long)pplVar27 + 1);
          uVar22 = (ulong)*pbVar1;
        }
        pplVar27 = (long **)fast_atoreal_move<float>((char *)pplVar27,&paVar11->b,true);
      }
      uVar22 = (ulong)*(byte *)pplVar27;
      if ((uVar22 < 0x24) && ((0x800002400U >> (uVar22 & 0x3f) & 1) != 0)) {
        paVar11->a = 1.0;
      }
      else {
        while (((char)uVar22 == ' ' || ((int)uVar22 == 9))) {
          pbVar1 = (byte *)((long)pplVar27 + 1);
          pplVar27 = (long **)((long)pplVar27 + 1);
          uVar22 = (ulong)*pbVar1;
        }
        pplVar27 = (long **)fast_atoreal_move<float>((char *)pplVar27,&paVar11->a,true);
      }
    }
    if ((char)local_10cc != '\0') {
      for (; (*(byte *)pplVar27 == 0x20 || (*(byte *)pplVar27 == 9));
          pplVar27 = (long **)((long)pplVar27 + 1)) {
      }
      pfVar2 = &local_10a0->mTextureCoords[0]->x + local_10b8;
      for (pcVar12 = fast_atoreal_move<float>((char *)pplVar27,pfVar2,true);
          (*pcVar12 == ' ' || (*pcVar12 == '\t')); pcVar12 = pcVar12 + 1) {
      }
      fast_atoreal_move<float>(pcVar12,pfVar2 + 1,true);
    }
    uVar26 = uVar26 + 1;
  } while (uVar26 != local_1088);
  paVar21 = local_10a0->mFaces;
  iVar6 = (int)local_1098;
  local_10b8 = 0;
  uVar26 = local_10a8;
  do {
    bVar18 = *pbVar24;
    if (bVar18 == 0) {
      pLVar13 = DefaultLogger::get();
      Logger::error(pLVar13,"OFF: The number of faces in the header is incorrect");
      break;
    }
    for (lVar19 = 0;
        ((0xd < bVar18 || ((0x3401U >> (bVar18 & 0x1f) & 1) == 0)) && (lVar19 != 0x1000));
        lVar19 = lVar19 + 1) {
      *(byte *)((long)&local_1038 + lVar19) = bVar18;
      bVar18 = pbVar24[lVar19 + 1];
    }
    *(undefined1 *)((long)&local_1038 + lVar19) = 0;
    pbVar24 = pbVar24 + lVar19;
    while ((*pbVar24 < 0xe && ((0x3400U >> (*pbVar24 & 0x1f) & 1) != 0))) {
      pbVar24 = pbVar24 + 1;
    }
    for (pplVar27 = &local_1038; (cVar3 = *(char *)pplVar27, cVar3 == ' ' || (cVar3 == '\t'));
        pplVar27 = (long **)((long)pplVar27 + 1)) {
    }
    if ((byte)(cVar3 - 0x3aU) < 0xf6) {
LAB_0045ee16:
      pLVar13 = DefaultLogger::get();
      Logger::error(pLVar13,"OFF: Faces with zero indices aren\'t allowed");
      local_10a0->mNumFaces = local_10a0->mNumFaces - 1;
    }
    else {
      uVar25 = 0;
      do {
        uVar25 = (uint)(byte)(cVar3 - 0x30) + uVar25 * 10;
        cVar3 = *(char *)((long)pplVar27 + 1);
        pplVar27 = (long **)((long)pplVar27 + 1);
      } while (0xf5 < (byte)(cVar3 - 0x3aU));
      if (uVar25 - 10 < 0xfffffff7) goto LAB_0045ee16;
      paVar21->mNumIndices = uVar25;
      puVar14 = (uint *)operator_new__((ulong)(uVar25 * 4));
      paVar21->mIndices = puVar14;
      if (paVar21->mNumIndices != 0) {
        uVar26 = 0;
        do {
          for (; (cVar3 = *(char *)pplVar27, cVar3 == ' ' || (cVar3 == '\t'));
              pplVar27 = (long **)((long)pplVar27 + 1)) {
          }
          uVar25 = 0;
          if (0xf5 < (byte)(cVar3 - 0x3aU)) {
            uVar25 = 0;
            do {
              uVar25 = (uint)(byte)(cVar3 - 0x30) + uVar25 * 10;
              cVar3 = *(char *)((long)pplVar27 + 1);
              pplVar27 = (long **)((long)pplVar27 + 1);
            } while (0xf5 < (byte)(cVar3 - 0x3aU));
          }
          if ((uint)local_1098 <= uVar25) {
            pLVar13 = DefaultLogger::get();
            Logger::error(pLVar13,"OFF: Vertex index is out of range");
            uVar25 = iVar6 - 1;
          }
          paVar21->mIndices[uVar26] = uVar25;
          uVar26 = uVar26 + 1;
        } while (uVar26 < paVar21->mNumIndices);
      }
      local_10b8 = (ulong)((int)local_10b8 + 1);
      paVar21 = paVar21 + 1;
      uVar26 = local_10a8;
    }
  } while ((uint)local_10b8 < (uint)uVar26);
  this_00 = (aiNode *)operator_new(0x478);
  paVar5 = local_1040;
  aiNode::aiNode(this_00);
  paVar5->mRootNode = this_00;
  (this_00->mName).length = 9;
  builtin_strncpy((this_00->mName).data,"<OFFRoot>",10);
  this_00->mNumMeshes = 1;
  puVar14 = (uint *)operator_new__(4);
  this_00->mMeshes = puVar14;
  *puVar14 = 0;
  paVar5->mNumMaterials = 1;
  ppaVar15 = (aiMaterial **)operator_new__(8);
  paVar5->mMaterials = ppaVar15;
  this_01 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_01);
  local_1058 = (aiVector3D *)0x3f19999a3f19999a;
  pfStack_1050 = (float *)0x3f8000003f19999a;
  aiMaterial::AddBinaryProperty(this_01,&local_1058,0x10,"$clr.diffuse",0,0,aiPTI_Float);
  *paVar5->mMaterials = this_01;
  local_10bc = 1.4013e-45;
  aiMaterial::AddBinaryProperty(this_01,&local_10bc,4,"$mat.twosided",0,0,aiPTI_Integer);
  if ((byte *)local_1078._M_dataplus._M_p != (byte *)0x0) {
    operator_delete(local_1078._M_dataplus._M_p);
  }
  (*stream->_vptr_IOStream[1])(stream);
  return;
}

Assistant:

void OFFImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open OFF file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // Proper OFF header parser. We only implement normal loading for now.
    bool hasTexCoord = false, hasNormals = false, hasColors = false;
    bool hasHomogenous = false, hasDimension = false;
    unsigned int dimensions = 3;
    const char* car = buffer;
    const char* end = buffer + mBuffer2.size();
    NextToken(&car, end);
    
    if (car < end - 2 && car[0] == 'S' && car[1] == 'T') {
      hasTexCoord = true; car += 2;
    }
    if (car < end - 1 && car[0] == 'C') {
      hasColors = true; car++;
    }
    if (car < end- 1 && car[0] == 'N') {
      hasNormals = true; car++;
    }
    if (car < end - 1 && car[0] == '4') {
      hasHomogenous = true; car++;
    }
    if (car < end - 1 && car[0] == 'n') {
      hasDimension = true; car++;
    }
    if (car < end - 3 && car[0] == 'O' && car[1] == 'F' && car[2] == 'F') {
        car += 3;
	NextToken(&car, end);
    } else {
      // in case there is no OFF header (which is allowed by the
      // specification...), then we might have unintentionally read an
      // additional dimension from the primitive count fields
      dimensions = 3;
      hasHomogenous = false;
      NextToken(&car, end);
      
      // at this point the next token should be an integer number
      if (car >= end - 1 || *car < '0' || *car > '9') {
	throw DeadlyImportError("OFF: Header is invalid");
      }
    }
    if (hasDimension) {
        dimensions = strtoul10(car, &car);
	NextToken(&car, end);
    }
    if (dimensions > 3) {
        throw DeadlyImportError
	  ("OFF: Number of vertex coordinates higher than 3 unsupported");
    }

    NextToken(&car, end);
    const unsigned int numVertices = strtoul10(car, &car);
    NextToken(&car, end);
    const unsigned int numFaces = strtoul10(car, &car);
    NextToken(&car, end);
    strtoul10(car, &car);  // skip edge count
    NextToken(&car, end);

    if (!numVertices) {
        throw DeadlyImportError("OFF: There are no valid vertices");
    }
    if (!numFaces) {
        throw DeadlyImportError("OFF: There are no valid faces");
    }

    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];

    aiMesh* mesh = new aiMesh();
    pScene->mMeshes[0] = mesh;

    mesh->mNumFaces = numFaces;
    aiFace* faces = new aiFace[mesh->mNumFaces];
    mesh->mFaces = faces;

    mesh->mNumVertices = numVertices;
    mesh->mVertices = new aiVector3D[numVertices];
    mesh->mNormals = hasNormals ? new aiVector3D[numVertices] : nullptr;
    mesh->mColors[0] = hasColors ? new aiColor4D[numVertices] : nullptr;

    if (hasTexCoord) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[numVertices];
    }
    char line[4096];
    buffer = car;
    const char *sz = car;

    // now read all vertex lines
    for (unsigned int i = 0; i < numVertices; ++i) {
        if(!GetNextLine(buffer, line)) {
            ASSIMP_LOG_ERROR("OFF: The number of verts in the header is incorrect");
            break;
        }
        aiVector3D& v = mesh->mVertices[i];	
        sz = line;

	// helper array to write a for loop over possible dimension values
	ai_real* vec[3] = {&v.x, &v.y, &v.z};

	// stop at dimensions: this allows loading 1D or 2D coordinate vertices
        for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz, *vec[dim]);
	}

	// if has homogenous coordinate, divide others by this one
	if (hasHomogenous) {
	    SkipSpaces(&sz);
	    ai_real w = 1.;
	    sz = fast_atoreal_move<ai_real>(sz, w);
            for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	        *(vec[dim]) /= w;
	    }
	}

	// read optional normals
	if (hasNormals) {
	    aiVector3D& n = mesh->mNormals[i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.x);
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.y);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)n.z);
	}
	
	// reading colors is a pain because the specification says it can be
	// integers or floats, and any number of them between 1 and 4 included,
	// until the next comment or end of line
	// in theory should be testing type !
	if (hasColors) {
	    aiColor4D& c = mesh->mColors[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.r);
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.g);
            } else {
	        c.g = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.b);
            } else {
	        c.b = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.a);
            } else {
	        c.a = 1.;
	    }
	}
        if (hasTexCoord) {
	    aiVector3D& t = mesh->mTextureCoords[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)t.x);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)t.y);
	}
    }

    // load faces with their indices
    faces = mesh->mFaces;
    for (unsigned int i = 0; i < numFaces; ) {
        if(!GetNextLine(buffer,line)) {
            ASSIMP_LOG_ERROR("OFF: The number of faces in the header is incorrect");
            break;
        }
        unsigned int idx;
        sz = line; SkipSpaces(&sz);
        idx = strtoul10(sz,&sz);
        if(!idx || idx > 9) {
	    ASSIMP_LOG_ERROR("OFF: Faces with zero indices aren't allowed");
            --mesh->mNumFaces;
            continue;
	}
	faces->mNumIndices = idx;
        faces->mIndices = new unsigned int[faces->mNumIndices];
        for (unsigned int m = 0; m < faces->mNumIndices;++m) {
            SkipSpaces(&sz);
            idx = strtoul10(sz,&sz);
            if (idx >= numVertices) {
                ASSIMP_LOG_ERROR("OFF: Vertex index is out of range");
                idx = numVertices - 1;
            }
            faces->mIndices[m] = idx;
        }
        ++i;
        ++faces;
    }
    
    // generate the output node graph
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<OFFRoot>");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int [pScene->mRootNode->mNumMeshes];
    pScene->mRootNode->mMeshes[0] = 0;

    // generate a default material
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    aiMaterial* pcMat = new aiMaterial();

    aiColor4D clr( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 1.0 ) );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
    pScene->mMaterials[0] = pcMat;

    const int twosided = 1;
    pcMat->AddProperty(&twosided, 1, AI_MATKEY_TWOSIDED);
}